

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

Float __thiscall
pbrt::Vertex::PDFLightOrigin
          (Vertex *this,vector<pbrt::Light,_std::allocator<pbrt::Light>_> *infiniteLights,Vertex *v,
          LightSampler *lightSampler)

{
  undefined8 uVar1;
  Vector3f d;
  Point3<float> p;
  Vector3<float> v_00;
  Vector3f w_00;
  Vector3f w_01;
  bool bVar2;
  undefined8 in_RCX;
  time_t *__timer;
  Vertex *in_RDI;
  float fVar3;
  undefined4 uVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  Point3f PVar12;
  Vector3<float> VVar13;
  Float pdfChoice;
  Float pdfDir;
  Float pdfPos;
  Light light;
  Vector3f w;
  undefined4 in_stack_fffffffffffffdf8;
  Float in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  Float *pdfDir_00;
  Vertex *in_stack_fffffffffffffe10;
  undefined4 uVar14;
  float fVar15;
  float in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  float in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  time_t local_138;
  Float local_12c;
  float local_124;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f0;
  float local_e8;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *local_e0;
  undefined4 in_stack_ffffffffffffff2c;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *infiniteLights_00;
  float fVar16;
  float in_stack_ffffffffffffff54;
  float local_4;
  undefined1 auVar5 [64];
  undefined1 auVar7 [64];
  float fVar11;
  
  auVar10 = in_ZMM0._8_56_;
  uVar14 = (undefined4)in_RCX;
  fVar15 = (float)((ulong)in_RCX >> 0x20);
  PVar12 = Vertex::p(in_stack_fffffffffffffe10);
  auVar5._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  vmovlpd_avx(auVar5._0_16_);
  PVar12 = Vertex::p(in_stack_fffffffffffffe10);
  auVar6._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  vmovlpd_avx(auVar6._0_16_);
  auVar10 = ZEXT856(0);
  p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe28;
  p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_RDI;
  VVar13 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                      ,p);
  fVar11 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar10;
  infiniteLights_00 =
       (vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)vmovlpd_avx(auVar7._0_16_);
  uVar4 = (undefined4)((ulong)infiniteLights_00 >> 0x20);
  VVar13.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffffe10;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe0c;
  fVar16 = fVar11;
  fVar3 = LengthSquared<float>(VVar13);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar10 = ZEXT856(0);
    v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe4c;
    v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe48;
    v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe50;
    local_e0 = infiniteLights_00;
    VVar13 = Normalize<float>(v_00);
    fVar3 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    uVar1 = vmovlpd_avx(auVar8._0_16_);
    local_f0 = uVar1;
    local_e8 = fVar3;
    bVar2 = IsInfiniteLight(in_stack_fffffffffffffe10);
    if (bVar2) {
      LightSampler::LightSampler
                ((LightSampler *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (LightSampler *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      w_01.super_Tuple3<pbrt::Vector3,_float>.y = fVar16;
      w_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar4;
      w_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffff54;
      local_118 = uVar1;
      local_110 = fVar3;
      local_108 = uVar1;
      local_100 = fVar3;
      local_4 = InfiniteLightDensity
                          (infiniteLights_00,
                           (LightSampler *)CONCAT44(in_stack_ffffffffffffff2c,fVar11),w_01);
    }
    else {
      if (in_RDI->type == Light) {
        pdfDir_00 = (Float *)((long)&in_RDI->field_2 + 0x50);
      }
      else {
        pdfDir_00 = (Float *)((long)&in_RDI->field_2 + 200);
      }
      Light::Light((Light *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (Light *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      Light::Light((Light *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (Light *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      __timer = &local_138;
      local_12c = LightSampler::PMF((LightSampler *)
                                    CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                    (Light *)CONCAT44(in_stack_fffffffffffffdfc,
                                                      in_stack_fffffffffffffdf8));
      auVar10 = extraout_var;
      bVar2 = IsOnSurface(in_RDI);
      if (bVar2) {
        w_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffe50;
        w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe4c;
        w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe54;
        Light::PDF_Le((Light *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                      (Interaction *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      w_00,(Float *)in_RDI,(Float *)CONCAT44(fVar15,uVar14));
      }
      else {
        PVar12 = Vertex::p(in_stack_fffffffffffffe10);
        auVar9._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar9._8_56_ = auVar10;
        uVar1 = vmovlpd_avx(auVar9._0_16_);
        time(in_RDI,__timer);
        uVar4 = auVar9._0_4_;
        Medium::TaggedPointer
                  ((Medium *)CONCAT44(uVar4,in_stack_fffffffffffffe00),
                   (nullptr_t)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        PVar12.super_Tuple3<pbrt::Point3,_float>.z = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
        PVar12.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
        PVar12.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
        d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDI;
        d.super_Tuple3<pbrt::Vector3,_float>.x = fVar15;
        Ray::Ray((Ray *)CONCAT44(uVar4,in_stack_fffffffffffffe00),PVar12,d,in_stack_fffffffffffffdfc
                 ,(Medium *)0x65e854);
        Light::PDF_Le((Light *)in_RDI,(Ray *)CONCAT44(fVar15,uVar14),
                      (Float *)in_stack_fffffffffffffe10,pdfDir_00);
      }
      local_4 = local_124 * local_12c;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

Float PDFLightOrigin(const std::vector<Light> &infiniteLights, const Vertex &v,
                         LightSampler lightSampler) {
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return 0.;
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return sampling density for infinite light sources
            return InfiniteLightDensity(infiniteLights, lightSampler, w);

        } else {
            // Return sampling density for noninfinite light source
            Light light = (type == VertexType::Light) ? ei.light : si.areaLight;
            Float pdfPos, pdfDir, pdfChoice = lightSampler.PMF(light);
            if (IsOnSurface())
                light.PDF_Le(ei, w, &pdfPos, &pdfDir);
            else
                light.PDF_Le(Ray(p(), w, time()), &pdfPos, &pdfDir);
            return pdfPos * pdfChoice;
        }
    }